

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_robertson_constraints.c
# Opt level: O2

int check_flag(void *flagvalue,char *funcname,int opt)

{
  if (flagvalue == (void *)0x0 && opt == 0) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed - returned NULL pointer\n\n",funcname);
  }
  else {
    if (opt != 1) {
      return 0;
    }
    if (-1 < *flagvalue) {
      return 0;
    }
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",funcname);
  }
  return 1;
}

Assistant:

static int check_flag(void* flagvalue, const char* funcname, int opt)
{
  int* errflag;

  /* Check if SUNDIALS function returned NULL pointer - no memory allocated */
  if (opt == 0 && flagvalue == NULL)
  {
    fprintf(stderr, "\nSUNDIALS_ERROR: %s() failed - returned NULL pointer\n\n",
            funcname);
    return 1;
  }

  /* Check if flag < 0 */
  else if (opt == 1)
  {
    errflag = (int*)flagvalue;
    if (*errflag < 0)
    {
      fprintf(stderr, "\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
              funcname, *errflag);
      return 1;
    }
  }

  /* Check if function returned NULL pointer - no memory allocated */
  else if (opt == 2 && flagvalue == NULL)
  {
    fprintf(stderr, "\nMEMORY_ERROR: %s() failed - returned NULL pointer\n\n",
            funcname);
    return 1;
  }

  return 0;
}